

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O2

string * TidyConfigParser::formatCheckName(string *__return_storage_ptr__,string *checkName)

{
  pointer pcVar1;
  ulong uVar2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  int iVar5;
  difference_type dVar6;
  size_type sVar7;
  size_type sVar8;
  string capitalizedName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (checkName->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&capitalizedName);
  }
  else {
    capitalizedName._M_dataplus._M_p = (pointer)&capitalizedName.field_2;
    capitalizedName._M_string_length = 0;
    capitalizedName.field_2._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (&capitalizedName,checkName->_M_string_length);
    _Var3._M_p = capitalizedName._M_dataplus._M_p;
    pcVar1 = (checkName->_M_dataplus)._M_p;
    sVar8 = checkName->_M_string_length;
    for (sVar7 = 0; _Var4._M_p = capitalizedName._M_dataplus._M_p, sVar8 != sVar7; sVar7 = sVar7 + 1
        ) {
      iVar5 = tolower((int)pcVar1[sVar7]);
      _Var3._M_p[sVar7] = (char)iVar5;
    }
    iVar5 = toupper((int)*capitalizedName._M_dataplus._M_p);
    *_Var4._M_p = (char)iVar5;
    local_50._M_dataplus._M_p._0_1_ = 0x2d;
    dVar6 = std::
            __count_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )capitalizedName._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(capitalizedName._M_dataplus._M_p + capitalizedName._M_string_length),
                       (_Iter_equals_val<const_char>)&local_50);
    if (dVar6 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)capitalizedName._M_dataplus._M_p == &capitalizedName.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(capitalizedName.field_2._M_allocated_capacity._1_7_,
                      capitalizedName.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = capitalizedName.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = capitalizedName._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(capitalizedName.field_2._M_allocated_capacity._1_7_,
                      capitalizedName.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = capitalizedName._M_string_length;
      capitalizedName._M_string_length = 0;
      capitalizedName.field_2._M_local_buf[0] = '\0';
      capitalizedName._M_dataplus._M_p = (pointer)&capitalizedName.field_2;
    }
    else {
      uVar2 = checkName->_M_string_length;
      sVar8 = 0;
      while( true ) {
        sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(&capitalizedName,'-',sVar8);
        _Var3 = capitalizedName._M_dataplus;
        if (uVar2 <= sVar7) break;
        sVar8 = sVar7 + 1;
        iVar5 = toupper((int)capitalizedName._M_dataplus._M_p[sVar7 + 1]);
        _Var3._M_p[sVar7 + 1] = (char)iVar5;
      }
      sVar7 = 0;
      sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (&capitalizedName,'-',0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      while (sVar8 != 0xffffffffffffffff) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_50,&capitalizedName,sVar7,sVar8 - sVar7);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        sVar7 = sVar8 + 1;
        sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(&capitalizedName,'-',sVar7);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_50,&capitalizedName,sVar7,0xffffffffffffffff);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::~string((string *)&capitalizedName);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TidyConfigParser::formatCheckName(const std::string& checkName) {
    if (checkName.empty())
        return "";
    std::string capitalizedName;
    capitalizedName.resize(checkName.size());
    std::transform(checkName.begin(), checkName.end(), capitalizedName.begin(), ::tolower);
    // Input string is expected to have the format a-b-c-d-e...
    // Capitalize the first letter
    capitalizedName[0] = static_cast<char>(::toupper(capitalizedName[0]));
    if (std::count(capitalizedName.begin(), capitalizedName.end(), '-') == 0) {
        // If there are no '-' on the name, we are done
        return capitalizedName;
    }

    // Find all the '-' and capitalize the following char if exists
    auto nameLength = checkName.size();
    size_t pos = 0;
    while (true) {
        pos = capitalizedName.find('-', pos);
        // If pos+1 does not exist, or we have not found anymore '-' we can break.
        // Else capitalize the pos+1 letter
        if (pos == std::string::npos || nameLength <= pos)
            break;
        else {
            capitalizedName[pos + 1] = static_cast<char>(::toupper(capitalizedName[pos + 1]));
            pos += 1;
        }
    }

    // At this point the string should have the format Aa-Bb-Cc-....
    // Remove the '-' from the string and we are done
    size_t currentPos = 0;
    size_t nextPos = capitalizedName.find('-');
    std::string name;
    while (nextPos != std::string::npos) {
        name.append(capitalizedName.substr(currentPos, nextPos - currentPos));
        currentPos = nextPos + 1;
        nextPos = capitalizedName.find('-', currentPos);
    }
    name.append(capitalizedName.substr(currentPos));
    return name;
}